

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Status_set_elements(MPIABI_Status *status,MPIABI_Datatype datatype,int count)

{
  int iVar1;
  MPI_Status *pMVar2;
  ompi_datatype_t *poVar3;
  WPI_Handle<ompi_datatype_t_*> local_40 [3];
  WPI_StatusPtr local_28;
  int local_1c;
  MPIABI_Datatype MStack_18;
  int count_local;
  MPIABI_Datatype datatype_local;
  MPIABI_Status *status_local;
  
  local_1c = count;
  MStack_18 = datatype;
  datatype_local = (MPIABI_Datatype)status;
  WPI_StatusPtr::WPI_StatusPtr(&local_28,status);
  pMVar2 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_28);
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(local_40,MStack_18);
  poVar3 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)local_40);
  iVar1 = MPI_Status_set_elements(pMVar2,poVar3,local_1c);
  WPI_StatusPtr::~WPI_StatusPtr(&local_28);
  return iVar1;
}

Assistant:

int MPIABI_Status_set_elements(
  MPIABI_Status * status,
  MPIABI_Datatype datatype,
  int count
) {
  return MPI_Status_set_elements(
    (MPI_Status *)(WPI_StatusPtr)status,
    (MPI_Datatype)(WPI_Datatype)datatype,
    count
  );
}